

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  byte bVar1;
  curl_socket_t s_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  Curl_sh_entry *entry_00;
  uint local_68;
  uchar oldactions;
  uint uStack_64;
  _Bool stillused;
  uint j_1;
  uint j;
  int comboaction;
  uchar last_action;
  uchar cur_action;
  int rc;
  curl_socket_t s;
  Curl_sh_entry *entry;
  undefined1 auStack_40 [4];
  uint i;
  easy_pollset cur_poll;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  cur_poll._24_8_ = data;
  multi_getsock(data,(easy_pollset *)auStack_40);
  for (entry._4_4_ = 0; entry._4_4_ < (uint)cur_poll.sockets[3]; entry._4_4_ = entry._4_4_ + 1) {
    bVar1 = *(byte *)((long)cur_poll.sockets + (ulong)entry._4_4_ + 0x10);
    j._2_1_ = 0;
    s_00 = cur_poll.sockets[(ulong)entry._4_4_ - 2];
    _rc = sh_getentry(&multi->sockhash,s_00);
    if (_rc == (Curl_sh_entry *)0x0) {
      _rc = sh_addentry(&multi->sockhash,s_00);
      if (_rc == (Curl_sh_entry *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    else {
      for (uStack_64 = 0; uStack_64 < *(uint *)(cur_poll._24_8_ + 0xa4); uStack_64 = uStack_64 + 1)
      {
        if (s_00 == *(int *)(cur_poll._24_8_ + 0x90 + (ulong)uStack_64 * 4)) {
          j._2_1_ = *(byte *)(cur_poll._24_8_ + 0xa8 + (ulong)uStack_64);
          break;
        }
      }
    }
    if ((j._2_1_ == 0) || (j._2_1_ == bVar1)) {
      if (j._2_1_ == 0) {
        _rc->users = _rc->users + 1;
        if ((bVar1 & 1) != 0) {
          _rc->readers = _rc->readers + 1;
        }
        if ((bVar1 & 2) != 0) {
          _rc->writers = _rc->writers + 1;
        }
        pvVar6 = Curl_hash_add(&_rc->transfers,cur_poll.actions,8,(void *)cur_poll._24_8_);
        if (pvVar6 == (void *)0x0) {
          Curl_hash_destroy(&_rc->transfers);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else {
      if ((j._2_1_ & 1) != 0) {
        _rc->readers = _rc->readers - 1;
      }
      if ((j._2_1_ & 2) != 0) {
        _rc->writers = _rc->writers - 1;
      }
      if ((bVar1 & 1) != 0) {
        _rc->readers = _rc->readers + 1;
      }
      if ((bVar1 & 2) != 0) {
        _rc->writers = _rc->writers + 1;
      }
    }
    uVar3 = 0;
    if (_rc->writers != 0) {
      uVar3 = 2;
    }
    uVar3 = uVar3 | _rc->readers != 0;
    if ((j._2_1_ == 0) || (_rc->action != uVar3)) {
      if (multi->socket_cb != (curl_socket_callback)0x0) {
        set_in_callback(multi,true);
        iVar4 = (*multi->socket_cb)((CURL_conflict *)cur_poll._24_8_,s_00,uVar3,multi->socket_userp,
                                    _rc->socketp);
        set_in_callback(multi,false);
        if (iVar4 == -1) {
          multi->field_0x1b1 = multi->field_0x1b1 & 0xef | 0x10;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      _rc->action = uVar3;
    }
  }
  entry._4_4_ = 0;
  do {
    if (*(uint *)(cur_poll._24_8_ + 0xa4) <= entry._4_4_) {
      *(undefined8 *)(cur_poll._24_8_ + 0x90) = _auStack_40;
      *(undefined8 *)(cur_poll._24_8_ + 0x98) = cur_poll.sockets._0_8_;
      *(ulong *)(cur_poll._24_8_ + 0xa0) = CONCAT44(cur_poll.sockets[3],cur_poll.sockets[2]);
      *(undefined8 *)(cur_poll._24_8_ + 0xa8) = cur_poll._16_8_;
      return CURLM_OK;
    }
    bVar2 = false;
    iVar4 = *(int *)(cur_poll._24_8_ + 0x90 + (ulong)entry._4_4_ * 4);
    for (local_68 = 0; local_68 < (uint)cur_poll.sockets[3]; local_68 = local_68 + 1) {
      if (iVar4 == cur_poll.sockets[(ulong)local_68 - 2]) {
        bVar2 = true;
        break;
      }
    }
    if ((!bVar2) &&
       (entry_00 = sh_getentry(&multi->sockhash,iVar4), entry_00 != (Curl_sh_entry *)0x0)) {
      bVar1 = *(byte *)(cur_poll._24_8_ + 0xa8 + (ulong)entry._4_4_);
      entry_00->users = entry_00->users - 1;
      if ((bVar1 & 2) != 0) {
        entry_00->writers = entry_00->writers - 1;
      }
      if ((bVar1 & 1) != 0) {
        entry_00->readers = entry_00->readers - 1;
      }
      if (entry_00->users == 0) {
        if (multi->socket_cb != (curl_socket_callback)0x0) {
          set_in_callback(multi,true);
          iVar5 = (*multi->socket_cb)((CURL_conflict *)cur_poll._24_8_,iVar4,4,multi->socket_userp,
                                      entry_00->socketp);
          set_in_callback(multi,false);
          if (iVar5 == -1) {
            multi->field_0x1b1 = multi->field_0x1b1 & 0xef | 0x10;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry_00,&multi->sockhash,iVar4);
      }
      else {
        Curl_hash_delete(&entry_00->transfers,cur_poll.actions,8);
      }
    }
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < cur_poll.num; i++) {
    unsigned char cur_action = cur_poll.actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = cur_poll.sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j< data->last_poll.num; j++) {
        if(s == data->last_poll.sockets[j]) {
          last_action = data->last_poll.actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN)
        entry->readers--;
      if(last_action & CURL_POLL_OUT)
        entry->writers--;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action) {
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  /* Check for last_poll.sockets that no longer appear in cur_poll.sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i< data->last_poll.num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = data->last_poll.sockets[i];
    for(j = 0; j < cur_poll.num; j++) {
      if(s == cur_poll.sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->last_poll.actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  /* Remember for next time */
  memcpy(&data->last_poll, &cur_poll, sizeof(data->last_poll));
  return CURLM_OK;
}